

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  nk_panel **ppnVar1;
  nk_rect *pnVar2;
  float fVar3;
  nk_color c;
  uint uVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  nk_window *pnVar7;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var8;
  void *pvVar9;
  nk_size nVar10;
  nk_size nVar11;
  nk_size nVar12;
  undefined1 auVar13 [16];
  nk_vec2 nVar14;
  int iVar15;
  int iVar16;
  nk_panel *pnVar17;
  long lVar18;
  uint uVar19;
  nk_window *pnVar20;
  nk_panel *pnVar21;
  uint *puVar22;
  nk_panel_type nVar23;
  nk_page_element *pe;
  nk_context *i;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_rect b_00;
  nk_flags local_13c;
  nk_vec2 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined4 uStack_100;
  undefined4 uStack_fc;
  nk_flags state;
  float fStack_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  nk_rect local_60;
  nk_rect empty_east;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cd,"void nk_end(struct nk_context *)");
  }
  pnVar5 = ctx->current;
  if (pnVar5 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43ce,"void nk_end(struct nk_context *)");
  }
  pnVar6 = pnVar5->layout;
  if (pnVar6 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cf,"void nk_end(struct nk_context *)");
  }
  nVar23 = pnVar6->type;
  if ((nVar23 == NK_PANEL_WINDOW) && ((pnVar5->flags & 0x1000) != 0)) goto LAB_00127a5a;
  b = &pnVar5->buffer;
  uVar19 = pnVar6->flags;
  i = (nk_context *)0x0;
  if ((uVar19 >> 0xb & 1) == 0) {
    i = ctx;
  }
  if ((nVar23 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                NK_PANEL_GROUP)) == 0) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
    nVar23 = pnVar6->type;
    uVar19 = pnVar6->flags;
  }
  local_138 = (ctx->style).window.scrollbar_size;
  uStack_130 = 0;
  nVar14 = nk_panel_get_padding(&ctx->style,nVar23);
  auVar13._8_4_ = extraout_XMM0_Dc;
  auVar13._0_4_ = nVar14.x;
  auVar13._4_4_ = nVar14.y;
  auVar13._12_4_ = extraout_XMM0_Dd;
  fVar25 = (pnVar6->row).height + pnVar6->at_y;
  pnVar6->at_y = fVar25;
  local_128 = auVar13;
  if ((uVar19 & 0x4400) == 0x400) {
    fVar27 = (pnVar6->bounds).y;
    if (fVar25 < (pnVar6->bounds).h + fVar27) {
      (pnVar6->bounds).h = fVar25 - fVar27;
    }
    local_128._4_4_ = nVar14.y;
    rect.y = fVar27;
    rect.x = (pnVar5->bounds).x;
    rect.h = (float)local_128._4_4_;
    rect.w = (pnVar5->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar6->border + (float)local_128._0_4_;
    rect_00.y = (pnVar6->bounds).y;
    rect_00.x = (pnVar5->bounds).x;
    rect_00.h = (pnVar6->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar6->bounds).x + (pnVar6->bounds).w) - pnVar6->border;
    fVar25 = pnVar6->border + (float)local_128._0_4_;
    if ((*pnVar6->offset_y == 0) && ((pnVar6->flags & 0x20) == 0)) {
      fVar25 = fVar25 + local_138.x;
    }
    rect_01.y = (pnVar6->bounds).y;
    rect_01.h = (pnVar6->bounds).h;
    rect_01.w = fVar25;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    uVar19 = pnVar6->flags;
    if ((uVar19 & 0x20) == 0 && *pnVar6->offset_x != 0) {
      rect_02.y = (pnVar6->bounds).y + (pnVar6->bounds).h;
      rect_02.x = (pnVar5->bounds).x;
      rect_02.h = local_138.y;
      rect_02.w = (pnVar5->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      uVar19 = pnVar6->flags;
    }
  }
  if (((uVar19 & 0x4020) == 0) &&
     (pnVar5->scrollbar_hiding_timer <= 4.0 && pnVar5->scrollbar_hiding_timer != 4.0)) {
    _state = _state & 0xffffffff00000000;
    fVar25 = (pnVar6->bounds).y;
    fVar26 = (pnVar6->bounds).x + (pnVar6->bounds).w + (float)local_128._0_4_;
    fVar27 = (pnVar6->bounds).h;
    fVar29 = (float)*pnVar6->offset_y;
    fVar31 = fVar27 * 0.01;
    fVar30 = (float)(int)(pnVar6->at_y - fVar25);
    fVar32 = fVar27;
    if ((pnVar6->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar5 == ctx->active) {
        bVar24 = pnVar6->has_scrolling != 0;
      }
      else {
        bVar24 = false;
      }
      if ((i == (nk_context *)0x0) || ((0.0 < (i->input).mouse.scroll_delta & bVar24) == 0)) {
        uVar19 = 0;
      }
      else {
        uVar19 = 1;
        bVar24 = true;
      }
      pnVar5->scrolled = uVar19;
      fVar28 = local_138.x;
    }
    else {
      pnVar21 = pnVar5->layout;
      do {
        pnVar17 = pnVar21;
        pnVar21 = pnVar17->parent;
        pnVar7 = pnVar5;
      } while (pnVar17->parent != (nk_panel *)0x0);
      do {
        pnVar20 = pnVar7;
        pnVar7 = pnVar20->parent;
      } while (pnVar7 != (nk_window *)0x0);
      fVar28 = local_138.x;
      if ((pnVar20 == ctx->active) && (pnVar6->has_scrolling != 0)) {
        local_b8 = ZEXT416((uint)fVar27);
        local_88 = ZEXT416((uint)fVar25);
        local_c8 = ZEXT416((uint)fVar30);
        local_118._0_4_ = fVar31;
        local_d8._0_4_ = fVar29;
        local_e8._4_4_ = fVar27;
        local_e8._0_4_ = local_138.x;
        uStack_e0 = (undefined4)uStack_130;
        uStack_dc = uStack_130._4_4_;
        local_108._4_4_ = fVar25;
        local_108._0_4_ = fVar26;
        _uStack_100 = 0;
        pnVar2 = &pnVar6->bounds;
        local_a8._0_4_ = pnVar2->x;
        local_a8._4_4_ = pnVar2->y;
        local_78._0_4_ = (pnVar6->bounds).w;
        local_78._4_4_ = (pnVar6->bounds).h;
        uStack_a0 = 0;
        uStack_70 = 0;
        local_98 = pnVar5->layout;
        iVar15 = nk_input_is_mouse_hovering_rect(&i->input,*pnVar2);
        fVar26 = (float)local_108._0_4_;
        fVar25 = (float)local_108._4_4_;
        fVar28 = (float)local_e8._0_4_;
        fVar32 = (float)local_e8._4_4_;
        fVar29 = (float)local_d8._0_4_;
        fVar30 = (float)local_c8._0_4_;
        fVar31 = (float)local_118._0_4_;
        if (iVar15 == 0) {
          bVar24 = false;
          goto LAB_001270da;
        }
        fVar3 = (pnVar17->clip).x;
        if ((fVar3 <= (float)local_78 + (float)local_a8) &&
           ((float)local_a8 <= fVar3 + (pnVar17->clip).w)) {
          fVar3 = (pnVar17->clip).y;
          if ((fVar3 <= (float)local_b8._0_4_ + (float)local_88._0_4_) &&
             (pnVar21 = local_98, (float)local_88._0_4_ <= fVar3 + (pnVar17->clip).h)) {
            do {
              ppnVar1 = &pnVar21->parent;
              pnVar21->has_scrolling = 0;
              bVar24 = true;
              pnVar21 = *ppnVar1;
            } while (*ppnVar1 != (nk_panel *)0x0);
            goto LAB_001270da;
          }
        }
      }
      bVar24 = false;
    }
LAB_001270da:
    scroll.y = fVar25;
    scroll.x = fVar26;
    scroll.h = fVar32;
    scroll.w = fVar28;
    fVar25 = nk_do_scrollbarv(&state,b,scroll,(uint)bVar24,fVar29,fVar30,fVar27 * 0.1,fVar31,
                              &(ctx->style).scrollv,&i->input,(ctx->style).font);
    *pnVar6->offset_y = (nk_uint)(long)fVar25;
    if ((i != (nk_context *)0x0) && (bVar24 != false)) {
      (i->input).mouse.scroll_delta = 0.0;
    }
    local_13c = 0;
    fVar25 = (pnVar6->bounds).x;
    fVar32 = (pnVar6->bounds).y + (pnVar6->bounds).h;
    fVar27 = pnVar6->max_x;
    fVar26 = (float)(int)(fVar27 - fVar25);
    font = (ctx->style).font;
    local_ec = 1.0;
    if (1.0 <= local_138.y) {
      local_ec = local_138.y;
    }
    fVar30 = local_ec + local_ec;
    fVar29 = (pnVar6->bounds).w;
    local_f0 = fVar30;
    if (fVar30 <= fVar29) {
      local_f0 = fVar29;
    }
    _state = CONCAT44(fVar32,fVar25);
    fVar29 = 0.0;
    if (local_f0 < fVar26) {
      fVar29 = (float)*pnVar6->offset_x;
      fVar31 = fVar27 * 0.05;
      local_d8 = ZEXT416((uint)fVar26);
      local_108._0_4_ = local_f0;
      local_108._4_4_ = 0;
      uStack_100 = 0;
      uStack_fc = 0;
      local_e8._4_4_ = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      empty_east.y = fVar32;
      empty_east.h = local_ec;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_88 = ZEXT416((uint)fVar30);
        local_c8 = ZEXT416((uint)fVar32);
        _local_108 = ZEXT416((uint)local_f0);
        _local_e8 = ZEXT416((uint)fVar25);
        local_a8 = CONCAT44(local_a8._4_4_,fVar31);
        if (fVar27 * 0.005 <= fVar31) {
          fVar31 = fVar27 * 0.005;
        }
        local_b8._0_4_ = fVar31;
        local_118 = ZEXT416((uint)local_ec);
        local_78 = CONCAT44(fVar32,fVar25);
        uStack_70 = 0;
        local_98 = (nk_panel *)CONCAT44(local_ec,local_ec);
        bounds.y = fVar32;
        bounds.x = fVar25;
        bounds.h = local_ec;
        bounds.w = local_ec;
        fStack_90 = local_ec;
        fStack_8c = local_ec;
        iVar15 = nk_do_button_symbol((nk_flags *)&local_60,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&i->input,
                                     font);
        fVar25 = 0.0;
        if (iVar15 != 0) {
          fVar25 = (float)local_b8._0_4_;
        }
        fVar29 = fVar29 - fVar25;
        fVar25 = (float)local_e8._0_4_ + (float)local_108._0_4_;
        local_108._0_4_ = (float)local_108._0_4_ - (float)local_88._0_4_;
        bounds_00.y = (float)local_78._4_4_;
        bounds_00.x = fVar25 - (float)local_118._0_4_;
        bounds_00._8_8_ = local_98;
        iVar15 = nk_do_button_symbol((nk_flags *)&local_60,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&i->input,font);
        if (iVar15 != 0) {
          fVar29 = fVar29 + (float)local_b8._0_4_;
        }
        fVar25 = (float)local_e8._0_4_ + (float)local_118._0_4_;
        _state = CONCAT44(fStack_f4,fVar25);
        fVar31 = (float)local_a8;
        fVar26 = (float)local_d8._0_4_;
        empty_east.y = (float)local_c8._0_4_;
        empty_east.h = (float)local_118._0_4_;
      }
      if ((float)local_108._0_4_ <= fVar31) {
        fVar31 = (float)local_108._0_4_;
      }
      if (fVar26 - (float)local_108._0_4_ <= fVar29) {
        fVar29 = fVar26 - (float)local_108._0_4_;
      }
      fVar27 = 0.0;
      if (0.0 <= fVar29) {
        fVar27 = fVar29;
      }
      fVar32 = (ctx->style).scrollh.border;
      nVar14 = (ctx->style).scrollh.padding;
      fVar29 = nVar14.x;
      fVar30 = nVar14.y;
      local_60.x = (fVar27 / fVar26) * (float)local_108._0_4_ + fVar25 + fVar32 + fVar29;
      local_60.y = empty_east.y + fVar32 + fVar30;
      local_60.w = ((float)local_108._0_4_ / fVar26) * (float)local_108._0_4_ -
                   (fVar29 + fVar29 + fVar32 + fVar32);
      local_60.h = empty_east.h - (fVar30 + fVar30 + fVar32 + fVar32);
      local_e8._0_4_ = fVar25;
      empty_east.x = local_60.w + local_60.x;
      local_40.w = local_60.x - fVar25;
      empty_east.w = (fVar25 + (float)local_108._0_4_) - empty_east.x;
      local_f0 = (float)local_108._0_4_;
      local_40.x = fVar25;
      local_40.y = empty_east.y;
      local_40.h = empty_east.h;
      fVar25 = nk_scrollbar_behavior
                         (&local_13c,&i->input,0,(nk_rect *)&state,&local_60,&local_40,&empty_east,
                          fVar27,fVar26,fVar31,NK_HORIZONTAL);
      local_118._0_4_ = fVar25;
      local_60.x = (fVar25 / (float)local_d8._0_4_) * (float)local_108._0_4_ + (float)local_e8._0_4_
      ;
      p_Var8 = (ctx->style).scrollh.draw_begin;
      if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var8)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
      nk_draw_scrollbar(b,local_13c,&(ctx->style).scrollh,(nk_rect *)&state,&local_60);
      p_Var8 = (ctx->style).scrollh.draw_end;
      if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var8)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
      fVar29 = (float)local_118._0_4_;
    }
    *pnVar6->offset_x = (nk_uint)(long)fVar29;
  }
  if ((pnVar5->flags & 0x80) == 0) {
LAB_00127509:
    pnVar5->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar25 = (ctx->input).mouse.delta.x;
    if ((((fVar25 != 0.0) || (NAN(fVar25))) || (fVar25 = (ctx->input).mouse.delta.y, fVar25 != 0.0))
       || (NAN(fVar25))) {
      bVar24 = false;
    }
    else {
      bVar24 = (ctx->input).mouse.scroll_delta == 0.0;
    }
    iVar15 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar24 & iVar15 != 0)) && (iVar15 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_00127509;
    pnVar5->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar5->scrollbar_hiding_timer;
  }
  uVar19 = pnVar6->flags;
  if ((uVar19 & 1) != 0) {
    nVar23 = pnVar6->type;
    if (nVar23 == NK_PANEL_TOOLTIP) {
LAB_001275b2:
      lVar18 = 0x1cd4;
    }
    else if (nVar23 == NK_PANEL_POPUP) {
      lVar18 = 0x1cc8;
    }
    else if (nVar23 == NK_PANEL_CONTEXTUAL) {
      lVar18 = 0x1cd0;
    }
    else if (nVar23 == NK_PANEL_COMBO) {
      lVar18 = 0x1ccc;
    }
    else {
      if (nVar23 == NK_PANEL_MENU) goto LAB_001275b2;
      lVar18 = 0x1cc4;
      if (nVar23 == NK_PANEL_GROUP) {
        lVar18 = 0x1cd8;
      }
    }
    c = *(nk_color *)((long)(ctx->style).cursors + lVar18 + -8);
    if ((uVar19 >> 0xe & 1) == 0) {
      if ((uVar19 >> 10 & 1) == 0) {
        fVar25 = (pnVar5->bounds).y;
        fVar27 = (pnVar5->bounds).h + fVar25;
      }
      else {
        fVar27 = (pnVar6->bounds).y + (pnVar6->bounds).h + pnVar6->footer_height;
        fVar25 = (pnVar5->bounds).y;
      }
    }
    else {
      fVar25 = (pnVar5->bounds).y;
      fVar27 = (ctx->style).window.border + fVar25 + pnVar6->header_height;
    }
    fVar26 = (pnVar5->bounds).x;
    nk_stroke_line(b,fVar26,fVar25,(pnVar5->bounds).w + fVar26,fVar25,pnVar6->border,c);
    fVar25 = (pnVar5->bounds).x;
    nk_stroke_line(b,fVar25,fVar27,(pnVar5->bounds).w + fVar25,fVar27,pnVar6->border,c);
    fVar25 = pnVar6->border * 0.5 + (pnVar5->bounds).x;
    nk_stroke_line(b,fVar25,(pnVar5->bounds).y,fVar25,fVar27,pnVar6->border,c);
    fVar25 = ((pnVar5->bounds).x + (pnVar5->bounds).w) - pnVar6->border * 0.5;
    nk_stroke_line(b,fVar25,(pnVar5->bounds).y,fVar25,fVar27,pnVar6->border,c);
    uVar19 = pnVar6->flags;
  }
  if (((uVar19 & 0x4004) == 4) && (i != (nk_context *)0x0)) {
    fVar25 = (pnVar6->bounds).y + (pnVar6->bounds).h;
    local_128._0_4_ = (pnVar6->bounds).x + (pnVar6->bounds).w + (float)local_128._0_4_;
    if ((uVar19 & 0x20) != 0) {
      local_128._0_4_ = (float)local_128._0_4_ - local_138.x;
    }
    local_128._4_4_ = fVar25;
    local_128._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar25;
      r_00.x = (float)local_128._0_4_;
      r_00.w = local_138.x;
      r_00.h = local_138.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      nk_fill_triangle(b,local_138.x + (float)local_128._0_4_,fVar25,
                       local_138.x + (float)local_128._0_4_,local_138.y + fVar25,
                       (float)local_128._0_4_,local_138.y + fVar25,
                       (ctx->style).window.scaler.data.color);
    }
    auVar13 = local_128;
    if ((pnVar5->flags & 0x800) == 0) {
      fVar25 = (ctx->style).window.min_size.y;
      iVar15 = (i->input).mouse.buttons[0].down;
      b_00.w = local_138.x;
      b_00.h = local_138.y;
      b_00.x = (float)local_128._0_4_;
      b_00.y = (float)local_128._4_4_;
      local_128 = auVar13;
      iVar16 = nk_input_has_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_00,1);
      uVar19 = pnVar6->flags;
      if ((iVar15 != 0) && (iVar16 != 0)) {
        fVar27 = (i->input).mouse.delta.x;
        fVar32 = (pnVar5->bounds).w + fVar27;
        fVar26 = (ctx->style).window.min_size.x;
        if (fVar32 <= fVar26) {
          fVar32 = fVar26;
        }
        (pnVar5->bounds).w = fVar32;
        if ((uVar19 >> 10 & 1) == 0) {
          fVar26 = (i->input).mouse.delta.y;
          fVar32 = (pnVar5->bounds).h + fVar26;
          if (fVar32 <= fVar25) {
            fVar32 = fVar25;
          }
          (pnVar5->bounds).h = fVar32;
        }
        else {
          fVar26 = (i->input).mouse.delta.y;
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        nVar14.y = (float)local_128._4_4_ + fVar26 + local_138.y * 0.5;
        nVar14.x = (float)local_128._0_4_ + fVar27 + local_138.x * 0.5;
        (i->input).mouse.buttons[0].clicked_pos = nVar14;
      }
    }
    else {
      uVar19 = pnVar6->flags;
    }
  }
  if ((pnVar6->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((uVar19 >> 0xc & 1) == 0) {
      (pnVar5->buffer).end = (ctx->memory).allocated;
      pnVar21 = pnVar5->layout;
      if ((pnVar21->popup_buffer).active != 0) {
        pvVar9 = (ctx->memory).memory.ptr;
        nVar10 = (pnVar21->popup_buffer).last;
        nVar11 = (pnVar5->buffer).last;
        nVar12 = (pnVar21->popup_buffer).end;
        *(nk_size *)((long)pvVar9 + (pnVar21->popup_buffer).parent + 8) = nVar12;
        *(undefined8 *)((long)pvVar9 + nVar10 + 8) = *(undefined8 *)((long)pvVar9 + nVar11 + 8);
        *(nk_size *)((long)pvVar9 + nVar11 + 8) = (pnVar21->popup_buffer).begin;
        (pnVar5->buffer).last = nVar10;
        (pnVar5->buffer).end = nVar12;
        (pnVar21->popup_buffer).active = 0;
      }
    }
    else {
      (pnVar5->buffer).last = 0;
      (pnVar5->buffer).begin = 0;
      (pnVar5->buffer).end = 0;
      (pnVar5->buffer).clip = nk_null_rect;
      uVar19 = pnVar6->flags;
    }
  }
  if ((short)uVar19 < 0) {
    uVar19 = uVar19 & 0xffff77ff;
    pnVar6->flags = uVar19;
  }
  pnVar5->flags = uVar19;
  iVar15 = (pnVar5->property).active;
  if (iVar15 == 0) {
    uVar19 = (pnVar5->property).seq;
LAB_0012797d:
    (pnVar5->property).old = uVar19;
    (pnVar5->property).prev = iVar15;
    (pnVar5->property).seq = 0;
  }
  else {
    uVar4 = (pnVar5->property).seq;
    uVar19 = (pnVar5->property).old;
    if ((uVar19 == uVar4) || (uVar19 = uVar4, iVar15 != (pnVar5->property).prev)) goto LAB_0012797d;
    nk_zero(&pnVar5->property,0x60);
  }
  iVar15 = (pnVar5->edit).active;
  if (iVar15 == 0) {
    uVar19 = (pnVar5->edit).seq;
LAB_001279d3:
    (pnVar5->edit).old = uVar19;
    (pnVar5->edit).prev = iVar15;
    (pnVar5->edit).seq = 0;
  }
  else {
    uVar4 = (pnVar5->edit).seq;
    uVar19 = (pnVar5->edit).old;
    if ((uVar19 == uVar4) || (uVar19 = uVar4, iVar15 != (pnVar5->edit).prev)) goto LAB_001279d3;
    nk_zero(&pnVar5->edit,0x2c);
  }
  if ((pnVar5->popup).active_con == 0) {
    uVar19 = (pnVar5->popup).con_count;
LAB_00127a1b:
    puVar22 = &(pnVar5->popup).con_count;
    (pnVar5->popup).con_old = uVar19;
  }
  else {
    uVar19 = (pnVar5->popup).con_old;
    if (uVar19 == (pnVar5->popup).con_count) goto LAB_00127a1b;
    puVar22 = &(pnVar5->popup).active_con;
    (pnVar5->popup).con_count = 0;
    (pnVar5->popup).con_old = 0;
  }
  *puVar22 = 0;
  (pnVar5->popup).combo_count = 0;
  if ((pnVar6->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x41f2,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_00127a5a:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);

    layout = ctx->current->layout;
    if (!ctx || !ctx->current) return;
    if (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN)) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}